

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  _func_void_basic_string_view<char,_std::char_traits<char>_>_ptr *local_38;
  function<void_(const_std::basic_string_view<char,_std::char_traits<char>_>_&)> local_30;
  undefined4 local_c;
  
  local_c = 0;
  local_38 = DebugCallback;
  std::function<void(std::basic_string_view<char,std::char_traits<char>>const&)>::
  function<void(*)(std::basic_string_view<char,std::char_traits<char>>const&),void>
            ((function<void(std::basic_string_view<char,std::char_traits<char>>const&)> *)&local_30,
             &local_38);
  KV::setDebugCallback(&local_30);
  std::function<void_(const_std::basic_string_view<char,_std::char_traits<char>_>_&)>::~function
            (&local_30);
  SerializeTest();
  ParseFileTest();
  ParseStringTest();
  ParseErrorTest();
  return 0;
}

Assistant:

int main()
{
#ifdef _WIN32
	SetConsoleOutputCP( CP_UTF8 );
#endif

	KV::setDebugCallback( &DebugCallback );

	SerializeTest();
	ParseFileTest();
	ParseStringTest();
	ParseErrorTest();

	return 0;
}